

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void * ZSTD_cwksp_reserve_internal(ZSTD_cwksp *ws,size_t bytes,ZSTD_cwksp_alloc_phase_e phase)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = ws->tableEnd;
  ZSTD_cwksp_internal_advance_phase(ws,phase);
  pvVar2 = (void *)((long)ws->allocStart - bytes);
  ZSTD_cwksp_assert_internal_consistency(ws);
  if (pvVar1 <= pvVar2) {
    if (pvVar2 < ws->tableValidEnd) {
      ws->tableValidEnd = pvVar2;
    }
    ws->allocStart = pvVar2;
    return pvVar2;
  }
  __assert_fail("alloc >= bottom",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1cdd,
                "void *ZSTD_cwksp_reserve_internal(ZSTD_cwksp *, size_t, ZSTD_cwksp_alloc_phase_e)")
  ;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_internal(
        ZSTD_cwksp* ws, size_t bytes, ZSTD_cwksp_alloc_phase_e phase) {
    void* alloc;
    void* bottom = ws->tableEnd;
    ZSTD_cwksp_internal_advance_phase(ws, phase);
    alloc = (BYTE *)ws->allocStart - bytes;

#if defined (ADDRESS_SANITIZER) && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* over-reserve space */
    alloc = (BYTE *)alloc - 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#endif

    DEBUGLOG(5, "cwksp: reserving %p %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(alloc >= bottom);
    if (alloc < bottom) {
        DEBUGLOG(4, "cwksp: alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    if (alloc < ws->tableValidEnd) {
        ws->tableValidEnd = alloc;
    }
    ws->allocStart = alloc;

#if defined (ADDRESS_SANITIZER) && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* Move alloc so there's ZSTD_CWKSP_ASAN_REDZONE_SIZE unused space on
     * either size. */
    alloc = (BYTE *)alloc + ZSTD_CWKSP_ASAN_REDZONE_SIZE;
    __asan_unpoison_memory_region(alloc, bytes);
#endif

    return alloc;
}